

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)> *
__thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>
::Iterator::Current(Iterator *this)

{
  tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
  *ptVar1;
  _Head_base<0UL,_unsigned_char,_false> _Var2;
  undefined7 uVar3;
  tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
  *ptVar4;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>,_std::default_delete<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_*,_std::default_delete<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>_>
      .
      super__Head_base<0UL,_const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_*,_false>
      ._M_head_impl ==
      (tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
       *)0x0) {
    ptVar4 = (tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
              *)operator_new(0x10);
    ptVar1 = (this->iterator_)._M_current;
    _Var2._M_head_impl =
         (ptVar1->
         super__Tuple_impl<0UL,_unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
         ).super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
    uVar3 = *(undefined7 *)
             &(ptVar1->
              super__Tuple_impl<0UL,_unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
              ).field_0x9;
    (ptVar4->
    super__Tuple_impl<0UL,_unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
    ).
    super__Tuple_impl<1UL,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
         = (_Tuple_impl<1UL,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
            )(ptVar1->
             super__Tuple_impl<0UL,_unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
             ).
             super__Tuple_impl<1UL,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
             .
             super__Head_base<1UL,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int),_false>
             ._M_head_impl;
    (ptVar4->
    super__Tuple_impl<0UL,_unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
    ).super__Head_base<0UL,_unsigned_char,_false> =
         (_Head_base<0UL,_unsigned_char,_false>)_Var2._M_head_impl;
    *(undefined7 *)
     &(ptVar4->
      super__Tuple_impl<0UL,_unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>
      ).field_0x9 = uVar3;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>,_std::default_delete<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_*,_std::default_delete<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>_>
    .
    super__Head_base<0UL,_const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_*,_false>
    ._M_head_impl = ptVar4;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>,_std::default_delete<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_*,_std::default_delete<const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_>_>
         .
         super__Head_base<0UL,_const_std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_short_*,_int,_int,_int)>_*,_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }